

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O1

void Min_CoverCreate(Vec_Str_t *vCover,Min_Cube_t *pCover,char Type)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t __size;
  
  if (pCover == (Min_Cube_t *)0x0) {
    __assert_fail("pCover != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinUtil.c"
                  ,0x58,"void Min_CoverCreate(Vec_Str_t *, Min_Cube_t *, char)");
  }
  vCover->nSize = 0;
  do {
    Min_CubeCreate(vCover,pCover,Type);
    pCover = pCover->pNext;
  } while (pCover != (Min_Cube_t *)0x0);
  uVar1 = vCover->nCap;
  if (vCover->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vCover->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vCover->pArray,0x10);
      }
      vCover->pArray = pcVar3;
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if ((int)__size <= (int)uVar1) goto LAB_003d3ed5;
      if (vCover->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(vCover->pArray,__size);
      }
      vCover->pArray = pcVar3;
    }
    vCover->nCap = (int)__size;
  }
LAB_003d3ed5:
  iVar2 = vCover->nSize;
  vCover->nSize = iVar2 + 1;
  vCover->pArray[iVar2] = '\0';
  return;
}

Assistant:

void Min_CoverCreate( Vec_Str_t * vCover, Min_Cube_t * pCover, char Type )
{
    Min_Cube_t * pCube;
    assert( pCover != NULL );
    Vec_StrClear( vCover );
    Min_CoverForEachCube( pCover, pCube )
        Min_CubeCreate( vCover, pCube, Type );
    Vec_StrPush( vCover, 0 );
}